

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshUtilities.cpp
# Opt level: O3

void Rml::MeshUtilities::GenerateQuad
               (Mesh *mesh,Vector2f origin,Vector2f dimensions,ColourbPremultiplied colour,
               Vector2f top_left_texcoord,Vector2f bottom_right_texcoord)

{
  pointer piVar1;
  pointer piVar2;
  pointer pVVar3;
  pointer piVar4;
  Vector2f VVar5;
  Vector2f VVar6;
  Vector2f VVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  float fVar13;
  float local_78;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  float local_38;
  float fStack_34;
  
  fVar13 = origin.y;
  piVar1 = (mesh->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar12 = ((long)(mesh->vertices).super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(mesh->vertices).super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
  piVar2 = (mesh->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::resize(&mesh->vertices,lVar12 + 4);
  ::std::vector<int,_std::allocator<int>_>::resize
            (&mesh->indices,
             ((long)(mesh->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(mesh->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) + 6);
  pVVar3 = (mesh->vertices).super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar4 = (mesh->indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar11 = (int)lVar12;
  local_78 = origin.x;
  pVVar3[iVar11].position.x = local_78;
  pVVar3[iVar11].position.y = fVar13;
  pVVar3[iVar11].colour = colour;
  local_58 = top_left_texcoord.x;
  fStack_54 = top_left_texcoord.y;
  pVVar3[iVar11].tex_coord.x = local_58;
  pVVar3[iVar11].tex_coord.y = fStack_54;
  iVar8 = iVar11 + 1;
  pVVar3[iVar8].position.y = fVar13;
  pVVar3[iVar8].colour = colour;
  local_48 = bottom_right_texcoord.x;
  fStack_44 = bottom_right_texcoord.y;
  VVar5.y = fStack_54;
  VVar5.x = local_48;
  pVVar3[iVar8].tex_coord = VVar5;
  local_38 = dimensions.x;
  fStack_34 = dimensions.y;
  pVVar3[iVar8].position.x = local_38 + local_78;
  iVar9 = iVar11 + 2;
  VVar6.y = fStack_34 + fVar13;
  VVar6.x = local_38 + local_78;
  pVVar3[iVar9].position = VVar6;
  pVVar3[iVar9].colour = colour;
  pVVar3[iVar9].tex_coord.x = local_48;
  pVVar3[iVar9].tex_coord.y = fStack_44;
  iVar10 = iVar11 + 3;
  pVVar3[iVar10].position.x = local_78;
  pVVar3[iVar10].position.y = fStack_34 + fVar13;
  pVVar3[iVar10].colour = colour;
  VVar7.y = fStack_44;
  VVar7.x = local_58;
  pVVar3[iVar10].tex_coord = VVar7;
  lVar12 = ((long)piVar1 - (long)piVar2) * 0x40000000;
  *(int *)((long)piVar4 + (lVar12 >> 0x1e)) = iVar11;
  *(int *)((long)piVar4 + (lVar12 + 0x100000000 >> 0x1e)) = iVar10;
  *(int *)((long)piVar4 + (lVar12 + 0x200000000 >> 0x1e)) = iVar8;
  *(int *)((long)piVar4 + (lVar12 + 0x300000000 >> 0x1e)) = iVar8;
  *(int *)((long)piVar4 + (lVar12 + 0x400000000 >> 0x1e)) = iVar10;
  *(int *)((long)piVar4 + (lVar12 + 0x500000000 >> 0x1e)) = iVar9;
  return;
}

Assistant:

void MeshUtilities::GenerateQuad(Mesh& mesh, Vector2f origin, Vector2f dimensions, ColourbPremultiplied colour, Vector2f top_left_texcoord,
	Vector2f bottom_right_texcoord)
{
	const int v0 = (int)mesh.vertices.size();
	const int i0 = (int)mesh.indices.size();

	mesh.vertices.resize(mesh.vertices.size() + 4);
	mesh.indices.resize(mesh.indices.size() + 6);
	Vertex* vertices = mesh.vertices.data();
	int* indices = mesh.indices.data();

	vertices[v0 + 0].position = origin;
	vertices[v0 + 0].colour = colour;
	vertices[v0 + 0].tex_coord = top_left_texcoord;

	vertices[v0 + 1].position = Vector2f(origin.x + dimensions.x, origin.y);
	vertices[v0 + 1].colour = colour;
	vertices[v0 + 1].tex_coord = Vector2f(bottom_right_texcoord.x, top_left_texcoord.y);

	vertices[v0 + 2].position = origin + dimensions;
	vertices[v0 + 2].colour = colour;
	vertices[v0 + 2].tex_coord = bottom_right_texcoord;

	vertices[v0 + 3].position = Vector2f(origin.x, origin.y + dimensions.y);
	vertices[v0 + 3].colour = colour;
	vertices[v0 + 3].tex_coord = Vector2f(top_left_texcoord.x, bottom_right_texcoord.y);

	indices[i0 + 0] = v0 + 0;
	indices[i0 + 1] = v0 + 3;
	indices[i0 + 2] = v0 + 1;

	indices[i0 + 3] = v0 + 1;
	indices[i0 + 4] = v0 + 3;
	indices[i0 + 5] = v0 + 2;
}